

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O1

QDateTime __thiscall QDateTime::addMSecs(QDateTime *this,qint64 msecs)

{
  StatusFlags *pSVar1;
  undefined8 uVar2;
  uint uVar3;
  ulong uVar4;
  qint64 qVar5;
  QDateTimePrivate *pQVar6;
  QDateTimePrivate *pQVar7;
  long in_RDX;
  long lVar8;
  long lVar9;
  QDateTimePrivate *pQVar10;
  
  uVar4 = *(ulong *)msecs;
  if ((uVar4 & 1) == 0) {
    uVar4 = (ulong)*(uint *)(uVar4 + 4);
  }
  if ((uVar4 & 8) == 0) {
    QDateTime(this);
    return (QDateTime)(Data)this;
  }
  (this->d).d = (QDateTimePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QDateTime(this,(QDateTime *)msecs);
  uVar4 = *(ulong *)msecs;
  if ((uVar4 & 1) == 0) {
    uVar3 = *(uint *)(uVar4 + 4);
  }
  else {
    uVar3 = (uint)uVar4;
  }
  if ((uVar3 >> 4 & 3) - 1 < 2) {
    if ((uVar4 & 1) == 0) {
      lVar8 = *(long *)(uVar4 + 8);
    }
    else {
      lVar8 = (long)uVar4 >> 8;
    }
    lVar9 = lVar8 + in_RDX;
    if (!SCARRY8(lVar8,in_RDX)) {
      if (((uVar4 & 1) != 0) && (lVar9 + 0x80000000000000U >> 0x38 == 0)) {
        (this->d).d = (QDateTimePrivate *)(lVar9 * 0x100 | (ulong)*(byte *)&this->d);
        return (QDateTime)(Data)this;
      }
      pQVar10 = (this->d).d;
      if (((ulong)pQVar10 & 1) == 0) {
        if ((__int_type_conflict)
            (pQVar10->super_QSharedData).ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 1)
        goto LAB_00352722;
        pQVar7 = (QDateTimePrivate *)operator_new(0x20);
        (pQVar7->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i = 0;
        uVar2 = *(undefined8 *)((long)&pQVar10->m_msecs + 4);
        *(undefined8 *)&pQVar7->m_status = *(undefined8 *)&pQVar10->m_status;
        *(undefined8 *)((long)&pQVar7->m_msecs + 4) = uVar2;
        QTimeZone::QTimeZone(&pQVar7->m_timeZone,&pQVar10->m_timeZone);
      }
      else {
        pQVar7 = (QDateTimePrivate *)operator_new(0x20);
        pQVar7->super_QSharedData = (QAtomicInt)0x0;
        pQVar7->m_status = (QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>)0x0;
        pQVar7->m_msecs = 0;
        pQVar7->m_offsetFromUtc = 0;
        QTimeZone::QTimeZone(&pQVar7->m_timeZone);
        pQVar6 = (this->d).d;
        (pQVar7->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
        super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i = (uint)pQVar6 & 0xfe;
        pQVar7->m_msecs = (long)pQVar6 >> 8;
      }
      (pQVar7->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i = 1;
      if (((ulong)pQVar10 & 1) == 0) {
        pQVar10 = (this->d).d;
        LOCK();
        (pQVar10->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type_conflict)
              (pQVar10->super_QSharedData).ref.super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
        UNLOCK();
        if (((__int_type_conflict)
             (pQVar10->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) &&
           (pQVar10 = (this->d).d, pQVar10 != (QDateTimePrivate *)0x0)) {
          QTimeZone::~QTimeZone(&pQVar10->m_timeZone);
          operator_delete(pQVar10,0x20);
        }
      }
      (this->d).d = pQVar7;
LAB_00352722:
      ((this->d).d)->m_msecs = lVar9;
      return (QDateTime)(Data)this;
    }
    pQVar10 = (this->d).d;
    if (((ulong)pQVar10 & 1) != 0) goto LAB_00352654;
    if ((pQVar10->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i == 1) goto LAB_0035261f;
    pQVar6 = (QDateTimePrivate *)operator_new(0x20);
  }
  else {
    qVar5 = toMSecsSinceEpoch((QDateTime *)msecs);
    if (!SCARRY8(qVar5,in_RDX)) {
      setMSecsSinceEpoch(this,qVar5 + in_RDX);
      return (QDateTime)(Data)this;
    }
    pQVar10 = (this->d).d;
    if (((ulong)pQVar10 & 1) != 0) {
LAB_00352654:
      *(byte *)&this->d = *(byte *)&this->d & 0xf1;
      return (QDateTime)(Data)this;
    }
    if ((__int_type_conflict)
        (pQVar10->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> == 1) goto LAB_0035261f;
    pQVar6 = (QDateTimePrivate *)operator_new(0x20);
  }
  (pQVar6->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> = (__atomic_base<int>)0x0;
  uVar2 = *(undefined8 *)((long)&pQVar10->m_msecs + 4);
  *(undefined8 *)&pQVar6->m_status = *(undefined8 *)&pQVar10->m_status;
  *(undefined8 *)((long)&pQVar6->m_msecs + 4) = uVar2;
  QTimeZone::QTimeZone(&pQVar6->m_timeZone,&pQVar10->m_timeZone);
  (pQVar6->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> = (__atomic_base<int>)0x1;
  pQVar10 = (this->d).d;
  LOCK();
  (pQVar10->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type_conflict)
        (pQVar10->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + -1);
  UNLOCK();
  if (((__int_type_conflict)
       (pQVar10->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int> == 0) &&
     (pQVar10 = (this->d).d, pQVar10 != (QDateTimePrivate *)0x0)) {
    QTimeZone::~QTimeZone(&pQVar10->m_timeZone);
    operator_delete(pQVar10,0x20);
  }
  (this->d).d = pQVar6;
LAB_0035261f:
  pSVar1 = &((this->d).d)->m_status;
  (pSVar1->super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>).
  super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i =
       (pSVar1->super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>).
       super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i & 0xfffffff1;
  return (QDateTime)(Data)this;
}

Assistant:

QDateTime QDateTime::addMSecs(qint64 msecs) const
{
    if (!isValid())
        return QDateTime();

    QDateTime dt(*this);
    switch (getSpec(d)) {
    case Qt::LocalTime:
    case Qt::TimeZone:
        // Convert to real UTC first in case this crosses a DST transition:
        if (!qAddOverflow(toMSecsSinceEpoch(), msecs, &msecs))
            dt.setMSecsSinceEpoch(msecs);
        else
            dt.d.invalidate();
        break;
    case Qt::UTC:
    case Qt::OffsetFromUTC:
        // No need to convert, just add on
        if (qAddOverflow(getMSecs(d), msecs, &msecs)) {
            dt.d.invalidate();
        } else if (d.isShort() && msecsCanBeSmall(msecs)) {
            dt.d.data.msecs = qintptr(msecs);
        } else {
            dt.d.detach();
            dt.d->m_msecs = msecs;
        }
        break;
    }
    return dt;
}